

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::EndRead3dmTable(ON_BinaryArchive *this,uint typecode)

{
  bool bVar1;
  ON_3dmArchiveTableType table;
  ON_3dmArchiveTableType OVar2;
  int iVar3;
  ON_3DM_BIG_CHUNK *pOVar4;
  ON_3DM_BIG_CHUNK *c;
  bool local_1d;
  ON_3dmArchiveTableType tt;
  bool rc;
  uint typecode_local;
  ON_BinaryArchive *this_local;
  
  if (typecode == 0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x263a,"","ON_BinaryArchive::EndRead3dmTable() bad typecode");
    this_local._7_1_ = false;
  }
  else {
    table = TableTypeFromTypecode(this,typecode);
    if (table == Unset) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x2641,"","ON_BinaryArchive::EndRead3dmTable() bad typecode");
      this_local._7_1_ = false;
    }
    else {
      OVar2 = Active3dmTable(this);
      if (OVar2 == table) {
        bVar1 = ArchiveContains3dmTable(this,table);
        if (bVar1) {
          if (this->m_3dm_version == 1) {
            iVar3 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Count(&this->m_chunk);
            if (iVar3 != 0) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                         ,0x2655,"",
                         "ON_BinaryArchive::EndRead3dmTable() v1 file m_chunk.Count() != 0");
              return false;
            }
            bVar1 = SeekFromStart(this,0x20);
            local_1d = (bool)(-bVar1 & 1);
          }
          else {
            iVar3 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Count(&this->m_chunk);
            if (iVar3 != 1) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                         ,0x265f,"",
                         "ON_BinaryArchive::EndRead3dmTable() v2 file m_chunk.Count() != 1");
              return false;
            }
            pOVar4 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Last(&this->m_chunk);
            if ((pOVar4 == (ON_3DM_BIG_CHUNK *)0x0) || (pOVar4->m_typecode != typecode)) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                         ,0x2665,"",
                         "ON_BinaryArchive::EndRead3dmTable() m_chunk.Last()->typecode != typecode")
              ;
              return false;
            }
            local_1d = EndRead3dmChunk(this);
          }
          this_local._7_1_ = End3dmTable(this,this->m_3dm_active_table,local_1d);
        }
        else {
          this_local._7_1_ = End3dmTable(this,table,true);
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x2647,"","ON_BinaryArchive::EndRead3dmTable() m_active_table != t");
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::EndRead3dmTable( unsigned int typecode )
{
  bool rc = false;
  if (0 == typecode)
  {
    ON_ERROR("ON_BinaryArchive::EndRead3dmTable() bad typecode");
    return false;
  }

  const ON_3dmArchiveTableType tt = TableTypeFromTypecode(typecode);
  if (tt == ON_3dmArchiveTableType::Unset)
  {
    ON_ERROR("ON_BinaryArchive::EndRead3dmTable() bad typecode");
    return false;
  }

  if ( Active3dmTable() != tt ) 
  {
    ON_ERROR("ON_BinaryArchive::EndRead3dmTable() m_active_table != t");
    return false;
  }

  if (false == ArchiveContains3dmTable(tt))
  {
    // This archive was written by code that was compiled before the table was added.
    return End3dmTable(tt,true);
  }

  if ( m_3dm_version == 1 ) 
  {
    if ( m_chunk.Count() != 0 )
    {
      ON_ERROR("ON_BinaryArchive::EndRead3dmTable() v1 file m_chunk.Count() != 0");
      return false;
    }
    // rewind for next table
    rc = SeekFromStart(32)?true:false;
  }
  else {
    {
      if ( m_chunk.Count() != 1 ) 
      {
        ON_ERROR("ON_BinaryArchive::EndRead3dmTable() v2 file m_chunk.Count() != 1");
        return false;
      }
      const ON_3DM_BIG_CHUNK* c = m_chunk.Last();
      if ( 0 == c || c->m_typecode != typecode ) 
      {
        ON_ERROR("ON_BinaryArchive::EndRead3dmTable() m_chunk.Last()->typecode != typecode");
        return false;
      }
      rc = EndRead3dmChunk();
    }
  }
  return End3dmTable(m_3dm_active_table,rc);
}